

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OtherVisitor.cpp
# Opt level: O3

void __thiscall OpenMD::WaterTypeVisitor::visit(WaterTypeVisitor *this,RigidBody *rb)

{
  string *propName;
  undefined8 *puVar1;
  iterator iVar2;
  long lVar3;
  pointer *pppAVar4;
  pointer *pppAVar5;
  char *__end;
  undefined8 *puVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var8;
  string *this_00;
  pointer ppAVar9;
  shared_ptr<OpenMD::GenericData> data;
  string rbName;
  vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> local_a0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_80;
  pointer local_78;
  pointer *local_70;
  undefined1 local_68 [16];
  key_type local_58;
  pointer local_38;
  
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  local_58._M_string_length = 0;
  local_58.field_2._M_local_buf[0] = '\0';
  (*(rb->super_StuntDouble)._vptr_StuntDouble[7])(&local_a0);
  std::__cxx11::string::operator=((string *)&local_58,(string *)&local_a0);
  if (local_a0.super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (pointer)&local_a0.super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl
                .super__Vector_impl_data._M_end_of_storage) {
    operator_delete(local_a0.super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_a0.
                          super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage + 1);
  }
  iVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::find(&(this->waterTypeList)._M_t,&local_58);
  if ((_Rb_tree_header *)iVar2._M_node != &(this->waterTypeList)._M_t._M_impl.super__Rb_tree_header)
  {
    std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::vector(&local_a0,&rb->atoms_);
    local_38 = local_a0.super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
               super__Vector_impl_data._M_finish;
    pppAVar5 = (pointer *)
               local_a0.super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
               super__Vector_impl_data._M_start;
    ppAVar9 = local_a0.super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
    if (local_a0.super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_a0.super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      local_78 = local_a0.super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage;
      p_Var7 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_70 = (pointer *)
                 local_a0.super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      pppAVar4 = (pointer *)
                 local_a0.super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      do {
        propName = (string *)*pppAVar4;
        local_a0.super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_a0.super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"ATOMDATA","");
        StuntDouble::getPropertyByName((StuntDouble *)local_68,propName);
        if (local_a0.super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
            super__Vector_impl_data._M_start !=
            (pointer)&local_a0.super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage) {
          operator_delete(local_a0.
                          super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (long)local_a0.
                                super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage + 1);
        }
        if ((_func_int **)local_68._0_8_ != (_func_int **)0x0) {
          lVar3 = __dynamic_cast(local_68._0_8_,&GenericData::typeinfo,&AtomData::typeinfo,0);
          p_Var8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          if (lVar3 != 0) {
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._8_8_ ==
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              p_Var8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            }
            else {
              p_Var8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._8_8_;
              if (__libc_single_threaded == '\0') {
                LOCK();
                *(_Atomic_word *)(local_68._8_8_ + 8) = *(_Atomic_word *)(local_68._8_8_ + 8) + 1;
                UNLOCK();
              }
              else {
                *(_Atomic_word *)(local_68._8_8_ + 8) = *(_Atomic_word *)(local_68._8_8_ + 8) + 1;
              }
            }
          }
          if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var7);
          }
          p_Var7 = p_Var8;
          if ((lVar3 != 0) &&
             (puVar1 = *(undefined8 **)(lVar3 + 0x28), puVar1 != *(undefined8 **)(lVar3 + 0x30))) {
            this_00 = (string *)*puVar1;
            p_Var7 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)puVar1[1];
            local_80 = p_Var8;
            if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
                UNLOCK();
              }
              else {
                p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
              }
            }
            while (p_Var8 = p_Var7, this_00 != (string *)0x0) {
              puVar6 = puVar1 + 2;
              std::__cxx11::string::find((char)this_00,0x5f);
              std::__cxx11::string::substr((ulong)&local_a0,(ulong)this_00);
              std::__cxx11::string::operator=(this_00,(string *)&local_a0);
              if (local_a0.super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
                  _M_impl.super__Vector_impl_data._M_start !=
                  (pointer)&local_a0.
                            super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage) {
                operator_delete(local_a0.
                                super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
                                _M_impl.super__Vector_impl_data._M_start,
                                (long)local_a0.
                                      super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage + 1);
              }
              if (puVar6 == *(undefined8 **)(lVar3 + 0x30)) {
                this_00 = (string *)0x0;
LAB_0021c371:
                p_Var7 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              }
              else {
                this_00 = (string *)*puVar6;
                p_Var7 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)puVar1[3];
                if (p_Var7 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)
                goto LAB_0021c371;
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
                  UNLOCK();
                }
                else {
                  p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
                }
              }
              puVar1 = puVar6;
              if (p_Var8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var8);
              }
            }
            p_Var7 = local_80;
            if (p_Var8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var8);
              p_Var7 = local_80;
            }
          }
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._8_8_);
        }
        pppAVar5 = local_70;
        ppAVar9 = local_78;
        pppAVar4 = pppAVar4 + 1;
      } while ((pointer)pppAVar4 != local_38);
      if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var7);
      }
    }
    if (pppAVar5 != (pointer *)0x0) {
      operator_delete(pppAVar5,(long)ppAVar9 - (long)pppAVar5);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,
                    CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                             local_58.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void WaterTypeVisitor::visit(RigidBody* rb) {
    std::string rbName;
    std::vector<Atom*> myAtoms;
    std::vector<Atom*>::iterator atomIter;
    std::vector<std::shared_ptr<AtomInfo>>::iterator i;
    std::shared_ptr<AtomData> atomData;

    rbName = rb->getType();

    if (waterTypeList.find(rbName) != waterTypeList.end()) {
      myAtoms = rb->getAtoms();

      for (atomIter = myAtoms.begin(); atomIter != myAtoms.end(); ++atomIter) {
        std::shared_ptr<GenericData> data =
            (*atomIter)->getPropertyByName("ATOMDATA");

        if (data != nullptr) {
          atomData = std::dynamic_pointer_cast<AtomData>(data);

          if (atomData == nullptr) continue;
        } else
          continue;

        for (std::shared_ptr<AtomInfo> atomInfo = atomData->beginAtomInfo(i);
             atomInfo; atomInfo                 = atomData->nextAtomInfo(i)) {
          atomInfo->atomTypeName = trimmedName(atomInfo->atomTypeName);
        }
      }
    }
  }